

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int GetLatestAliveMsgSeanet(SEANET *pSeanet)

{
  int iVar1;
  int local_3c;
  uchar local_38 [4];
  int nbdatabytes;
  uchar databuf [22];
  SEANET *pSeanet_local;
  
  local_3c = 0;
  memset(local_38,0,0x16);
  local_3c = 0;
  iVar1 = GetLatestMsgSeanet(pSeanet,4,local_38,0x16,&local_3c);
  if (iVar1 == 0) {
    pSeanet->HeadInf = (uint)databuf[0xc];
  }
  else {
    printf("A Seanet is not responding correctly. \n");
  }
  pSeanet_local._4_4_ = (uint)(iVar1 != 0);
  return pSeanet_local._4_4_;
}

Assistant:

inline int GetLatestAliveMsgSeanet(SEANET* pSeanet)
{
	unsigned char databuf[22];
	int nbdatabytes = 0;

	// Wait for a mtAlive message. It should come every 1 second.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMsgSeanet(pSeanet, mtAlive, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// HeadInf.
	pSeanet->HeadInf = (unsigned char)databuf[20];

	return EXIT_SUCCESS;
}